

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Instruction::addStringOperand(Instruction *this,char *str)

{
  char cVar1;
  int local_20;
  uint uStack_1c;
  char c;
  uint shiftAmount;
  uint word;
  char *str_local;
  Instruction *this_local;
  
  uStack_1c = 0;
  local_20 = 0;
  _shiftAmount = str;
  do {
    cVar1 = *_shiftAmount;
    uStack_1c = (int)cVar1 << ((byte)local_20 & 0x1f) | uStack_1c;
    local_20 = local_20 + 8;
    if (local_20 == 0x20) {
      addImmediateOperand(this,uStack_1c);
      uStack_1c = 0;
      local_20 = 0;
    }
    _shiftAmount = _shiftAmount + 1;
  } while (cVar1 != '\0');
  if (local_20 != 0) {
    addImmediateOperand(this,uStack_1c);
  }
  return;
}

Assistant:

void addStringOperand(const char* str)
    {
        unsigned int word = 0;
        unsigned int shiftAmount = 0;
        char c;

        do {
            c = *(str++);
            word |= ((unsigned int)c) << shiftAmount;
            shiftAmount += 8;
            if (shiftAmount == 32) {
                addImmediateOperand(word);
                word = 0;
                shiftAmount = 0;
            }
        } while (c != 0);

        // deal with partial last word
        if (shiftAmount > 0) {
            addImmediateOperand(word);
        }
    }